

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_function_helper
          (xpath_parser *this,ast_type_t type0,ast_type_t type1,size_t argc,xpath_ast_node **args)

{
  xpath_value_type xVar1;
  xpath_ast_node *this_00;
  ast_type_t local_3c;
  xpath_ast_node **args_local;
  size_t argc_local;
  ast_type_t type1_local;
  ast_type_t type0_local;
  xpath_parser *this_local;
  
  if (1 < argc) {
    __assert_fail("argc <= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                  ,0x224d,
                  "xpath_ast_node *pugi::impl::(anonymous namespace)::xpath_parser::parse_function_helper(ast_type_t, ast_type_t, size_t, xpath_ast_node **)"
                 );
  }
  if ((argc == 1) && (xVar1 = xpath_ast_node::rettype(*args), xVar1 != xpath_type_node_set)) {
    throw_error(this,"Function has to be applied to node set");
  }
  this_00 = (xpath_ast_node *)alloc_node(this);
  local_3c = type1;
  if (argc == 0) {
    local_3c = type0;
  }
  xpath_ast_node::xpath_ast_node(this_00,local_3c,xpath_type_string,*args,(xpath_ast_node *)0x0);
  return this_00;
}

Assistant:

xpath_ast_node* parse_function_helper(ast_type_t type0, ast_type_t type1, size_t argc, xpath_ast_node* args[2])
		{
			assert(argc <= 1);

			if (argc == 1 && args[0]->rettype() != xpath_type_node_set) throw_error("Function has to be applied to node set");

			return new (alloc_node()) xpath_ast_node(argc == 0 ? type0 : type1, xpath_type_string, args[0]);
		}